

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# period.cc
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  period *ppVar3;
  time_t tVar4;
  time_t tVar5;
  datetime d;
  accessor<3600UL> everyhour;
  iterator i;
  datetime n;
  period period;
  tm local_268;
  accessor<3600UL> local_228;
  tm local_218;
  time_t local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  long lStack_1b8;
  char *local_1b0;
  tm local_1a8;
  double local_170;
  accessor<3600UL> local_168;
  iterator local_158;
  period local_a8;
  
  setlocale(6,"");
  local_158.now.when._0_8_ = time((time_t *)0x0);
  local_218.tm_sec = 0;
  local_218.tm_min = 0;
  local_218.tm_hour = 0;
  local_218.tm_mday = 0;
  local_218.tm_mon = 0;
  local_218.tm_year = 0;
  local_218.tm_wday = 0;
  local_218.tm_yday = 0;
  local_218.tm_isdst = 0;
  local_218._36_4_ = 0;
  local_218.tm_gmtoff = 0;
  local_218.tm_zone = (char *)0x0;
  localtime_r((time_t *)&local_158,&local_218);
  local_a8.begin_.when._0_8_ = time((time_t *)0x0);
  local_158.now.when.tm_sec = 0;
  local_158.now.when.tm_min = 0;
  local_158.now.when.tm_hour = 0;
  local_158.now.when.tm_mday = 0;
  local_158.now.when.tm_mon = 0;
  local_158.now.when.tm_year = 0;
  local_158.now.when.tm_wday = 0;
  local_158.now.when.tm_yday = 0;
  local_158.now.when.tm_isdst = 0;
  local_158.now.when._36_4_ = 0;
  local_158.now.when.tm_gmtoff = 0;
  local_158.now.when.tm_zone = (char *)0x0;
  localtime_r((time_t *)&local_a8,(tm *)&local_158);
  local_158.now.when.tm_mday = local_158.now.when.tm_mday + 1;
  mktime((tm *)&local_158);
  local_158.now.when._8_8_ = (ulong)(uint)local_158.now.when.tm_mday << 0x20;
  mktime((tm *)&local_158);
  local_158.now.when._0_8_ = local_158.now.when._0_8_ & 0xffffffff;
  mktime((tm *)&local_158);
  local_158.now.when._0_8_ = local_158.now.when._0_8_ & 0xffffffff00000000;
  mktime((tm *)&local_158);
  local_a8.begin_.when.tm_sec = local_218.tm_sec;
  local_a8.begin_.when.tm_min = local_218.tm_min;
  local_a8.begin_.when.tm_hour = local_218.tm_hour;
  local_a8.begin_.when.tm_mday = local_218.tm_mday;
  local_a8.begin_.when.tm_mon = local_218.tm_mon;
  local_a8.begin_.when.tm_year = local_218.tm_year;
  local_a8.begin_.when.tm_wday = local_218.tm_wday;
  local_a8.begin_.when.tm_yday = local_218.tm_yday;
  local_a8.begin_.when.tm_isdst = local_218.tm_isdst;
  local_a8.begin_.when._36_4_ = local_218._36_4_;
  local_a8.begin_.when.tm_gmtoff = local_218.tm_gmtoff;
  local_a8.begin_.when.tm_zone = local_218.tm_zone;
  local_a8.end_.when.tm_sec = local_158.now.when.tm_sec;
  local_a8.end_.when.tm_min = local_158.now.when.tm_min;
  local_a8.end_.when.tm_hour = local_158.now.when.tm_hour;
  local_a8.end_.when.tm_mday = local_158.now.when.tm_mday;
  local_a8.end_.when.tm_mon = local_158.now.when.tm_mon;
  local_a8.end_.when.tm_year = local_158.now.when.tm_year;
  local_a8.end_.when.tm_wday = local_158.now.when.tm_wday;
  local_a8.end_.when.tm_yday = local_158.now.when.tm_yday;
  local_a8.end_.when.tm_isdst = local_158.now.when.tm_isdst;
  local_a8.end_.when._36_4_ = local_158.now.when._36_4_;
  local_a8.end_.when.tm_gmtoff = local_158.now.when.tm_gmtoff;
  local_a8.end_.when.tm_zone = local_158.now.when.tm_zone;
  local_228.step.value = 1.0;
  local_228.range = &local_a8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"every hour until tomorrow:",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  ppVar3 = local_228.range;
  local_218.tm_zone = ((local_228.range)->begin_).when.tm_zone;
  local_218.tm_sec = ((local_228.range)->begin_).when.tm_sec;
  local_218.tm_min = ((local_228.range)->begin_).when.tm_min;
  local_218.tm_hour = ((local_228.range)->begin_).when.tm_hour;
  local_218.tm_mday = ((local_228.range)->begin_).when.tm_mday;
  local_218.tm_mon = ((local_228.range)->begin_).when.tm_mon;
  local_218.tm_year = ((local_228.range)->begin_).when.tm_year;
  local_218.tm_wday = ((local_228.range)->begin_).when.tm_wday;
  local_218.tm_yday = ((local_228.range)->begin_).when.tm_yday;
  local_218.tm_isdst = ((local_228.range)->begin_).when.tm_isdst;
  local_218._36_4_ = *(undefined4 *)&((local_228.range)->begin_).when.field_0x24;
  local_218.tm_gmtoff = ((local_228.range)->begin_).when.tm_gmtoff;
  tVar4 = mktime(&local_218);
  local_218.tm_zone = (ppVar3->end_).when.tm_zone;
  local_218.tm_sec = (ppVar3->end_).when.tm_sec;
  local_218.tm_min = (ppVar3->end_).when.tm_min;
  local_218.tm_hour = (ppVar3->end_).when.tm_hour;
  local_218.tm_mday = (ppVar3->end_).when.tm_mday;
  local_218.tm_mon = (ppVar3->end_).when.tm_mon;
  local_218.tm_year = (ppVar3->end_).when.tm_year;
  local_218.tm_wday = (ppVar3->end_).when.tm_wday;
  local_218.tm_yday = (ppVar3->end_).when.tm_yday;
  local_218.tm_isdst = (ppVar3->end_).when.tm_isdst;
  local_218._36_4_ = *(undefined4 *)&(ppVar3->end_).when.field_0x24;
  local_218.tm_gmtoff = (ppVar3->end_).when.tm_gmtoff;
  tVar5 = mktime(&local_218);
  ppVar3 = local_228.range;
  if (tVar5 < tVar4) {
    local_158.now.when.tm_zone = ((local_228.range)->begin_).when.tm_zone;
    local_158.now.when.tm_sec = ((local_228.range)->begin_).when.tm_sec;
    local_158.now.when.tm_min = ((local_228.range)->begin_).when.tm_min;
    local_158.now.when.tm_hour = ((local_228.range)->begin_).when.tm_hour;
    local_158.now.when.tm_mday = ((local_228.range)->begin_).when.tm_mday;
    local_158.now.when.tm_mon = ((local_228.range)->begin_).when.tm_mon;
    local_158.now.when.tm_year = ((local_228.range)->begin_).when.tm_year;
    local_158.now.when.tm_wday = ((local_228.range)->begin_).when.tm_wday;
    local_158.now.when.tm_yday = ((local_228.range)->begin_).when.tm_yday;
    local_158.now.when.tm_isdst = ((local_228.range)->begin_).when.tm_isdst;
    local_158.now.when._36_4_ = *(undefined4 *)&((local_228.range)->begin_).when.field_0x24;
    local_158.now.when.tm_gmtoff = ((local_228.range)->begin_).when.tm_gmtoff;
    tVar4 = mktime((tm *)&local_158);
    local_268._0_8_ = tVar4 + -1;
    localtime_r((time_t *)&local_268,(tm *)&local_158);
    local_218.tm_zone = (ppVar3->end_).when.tm_zone;
    local_218.tm_sec = (ppVar3->end_).when.tm_sec;
    local_218.tm_min = (ppVar3->end_).when.tm_min;
    local_218.tm_hour = (ppVar3->end_).when.tm_hour;
    local_218.tm_mday = (ppVar3->end_).when.tm_mday;
    local_218.tm_mon = (ppVar3->end_).when.tm_mon;
    local_218.tm_year = (ppVar3->end_).when.tm_year;
    local_218.tm_wday = (ppVar3->end_).when.tm_wday;
    local_218.tm_yday = (ppVar3->end_).when.tm_yday;
    local_218.tm_isdst = (ppVar3->end_).when.tm_isdst;
    local_218._36_4_ = *(undefined4 *)&(ppVar3->end_).when.field_0x24;
    local_218.tm_gmtoff = (ppVar3->end_).when.tm_gmtoff;
    local_1b0 = (ppVar3->end_).when.tm_zone;
    local_1e0._0_4_ = (ppVar3->end_).when.tm_sec;
    local_1e0._4_4_ = (ppVar3->end_).when.tm_min;
    uStack_1d8._0_4_ = (ppVar3->end_).when.tm_hour;
    uStack_1d8._4_4_ = (ppVar3->end_).when.tm_mday;
    local_1d0._0_4_ = (ppVar3->end_).when.tm_mon;
    local_1d0._4_4_ = (ppVar3->end_).when.tm_year;
    uStack_1c8._0_4_ = (ppVar3->end_).when.tm_wday;
    uStack_1c8._4_4_ = (ppVar3->end_).when.tm_yday;
    local_1c0 = *(undefined8 *)&(ppVar3->end_).when.tm_isdst;
    lStack_1b8 = (ppVar3->end_).when.tm_gmtoff;
  }
  else {
    local_158.now.when.tm_zone = ((local_228.range)->end_).when.tm_zone;
    local_158.now.when.tm_sec = ((local_228.range)->end_).when.tm_sec;
    local_158.now.when.tm_min = ((local_228.range)->end_).when.tm_min;
    local_158.now.when.tm_hour = ((local_228.range)->end_).when.tm_hour;
    local_158.now.when.tm_mday = ((local_228.range)->end_).when.tm_mday;
    local_158.now.when.tm_mon = ((local_228.range)->end_).when.tm_mon;
    local_158.now.when.tm_year = ((local_228.range)->end_).when.tm_year;
    local_158.now.when.tm_wday = ((local_228.range)->end_).when.tm_wday;
    local_158.now.when.tm_yday = ((local_228.range)->end_).when.tm_yday;
    local_158.now.when.tm_isdst = ((local_228.range)->end_).when.tm_isdst;
    local_158.now.when._36_4_ = *(undefined4 *)&((local_228.range)->end_).when.field_0x24;
    local_158.now.when.tm_gmtoff = ((local_228.range)->end_).when.tm_gmtoff;
    tVar4 = mktime((tm *)&local_158);
    local_268._0_8_ = tVar4 + 1;
    localtime_r((time_t *)&local_268,(tm *)&local_158);
    local_218.tm_zone = (ppVar3->begin_).when.tm_zone;
    local_218.tm_sec = (ppVar3->begin_).when.tm_sec;
    local_218.tm_min = (ppVar3->begin_).when.tm_min;
    local_218.tm_hour = (ppVar3->begin_).when.tm_hour;
    local_218.tm_mday = (ppVar3->begin_).when.tm_mday;
    local_218.tm_mon = (ppVar3->begin_).when.tm_mon;
    local_218.tm_year = (ppVar3->begin_).when.tm_year;
    local_218.tm_wday = (ppVar3->begin_).when.tm_wday;
    local_218.tm_yday = (ppVar3->begin_).when.tm_yday;
    local_218.tm_isdst = (ppVar3->begin_).when.tm_isdst;
    local_218._36_4_ = *(undefined4 *)&(ppVar3->begin_).when.field_0x24;
    local_218.tm_gmtoff = (ppVar3->begin_).when.tm_gmtoff;
    local_1b0 = (ppVar3->begin_).when.tm_zone;
    local_1e0._0_4_ = (ppVar3->begin_).when.tm_sec;
    local_1e0._4_4_ = (ppVar3->begin_).when.tm_min;
    uStack_1d8._0_4_ = (ppVar3->begin_).when.tm_hour;
    uStack_1d8._4_4_ = (ppVar3->begin_).when.tm_mday;
    local_1d0._0_4_ = (ppVar3->begin_).when.tm_mon;
    local_1d0._4_4_ = (ppVar3->begin_).when.tm_year;
    uStack_1c8._0_4_ = (ppVar3->begin_).when.tm_wday;
    uStack_1c8._4_4_ = (ppVar3->begin_).when.tm_yday;
    local_1c0 = *(undefined8 *)&(ppVar3->begin_).when.tm_isdst;
    lStack_1b8 = (ppVar3->begin_).when.tm_gmtoff;
  }
  local_170 = local_228.step.value;
  local_1a8._0_8_ = local_158.now.when._0_8_;
  local_1a8._8_8_ = local_158.now.when._8_8_;
  local_1a8._16_8_ = local_158.now.when._16_8_;
  local_1a8._24_8_ = local_158.now.when._24_8_;
  local_1a8._32_8_ = local_158.now.when._32_8_;
  local_1a8.tm_gmtoff = local_158.now.when.tm_gmtoff;
  local_1a8.tm_zone = local_158.now.when.tm_zone;
  while( true ) {
    asap::detail::accessor<3600UL>::end(&local_158,&local_228);
    local_268.tm_zone = local_158.now.when.tm_zone;
    local_268.tm_isdst = local_158.now.when.tm_isdst;
    local_268._36_4_ = local_158.now.when._36_4_;
    local_268.tm_gmtoff = local_158.now.when.tm_gmtoff;
    local_268.tm_mon = local_158.now.when.tm_mon;
    local_268.tm_year = local_158.now.when.tm_year;
    local_268.tm_wday = local_158.now.when.tm_wday;
    local_268.tm_yday = local_158.now.when.tm_yday;
    local_268.tm_sec = local_158.now.when.tm_sec;
    local_268.tm_min = local_158.now.when.tm_min;
    local_268.tm_hour = local_158.now.when.tm_hour;
    local_268.tm_mday = local_158.now.when.tm_mday;
    tVar4 = mktime((tm *)&local_268);
    local_268.tm_zone = local_218.tm_zone;
    local_268.tm_isdst = local_218.tm_isdst;
    local_268._36_4_ = local_218._36_4_;
    local_268.tm_gmtoff = local_218.tm_gmtoff;
    local_268.tm_mon = local_218.tm_mon;
    local_268.tm_year = local_218.tm_year;
    local_268.tm_wday = local_218.tm_wday;
    local_268.tm_yday = local_218.tm_yday;
    local_268.tm_sec = local_218.tm_sec;
    local_268.tm_min = local_218.tm_min;
    local_268.tm_hour = local_218.tm_hour;
    local_268.tm_mday = local_218.tm_mday;
    tVar5 = mktime((tm *)&local_268);
    if (tVar4 == tVar5) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
    asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (datetime *)&local_218);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    dVar2 = local_170;
    local_218.tm_hour = local_218.tm_hour + (int)local_170;
    dVar1 = floor(local_170);
    dVar2 = (dVar2 - dVar1) * 60.0;
    local_218.tm_min = local_218.tm_min + (int)dVar2;
    dVar1 = floor(dVar2);
    local_218.tm_sec = local_218.tm_sec + (int)((dVar2 - dVar1) * 60.0);
    mktime(&local_218);
    local_158.now.when.tm_zone = local_218.tm_zone;
    local_158.now.when.tm_isdst = local_218.tm_isdst;
    local_158.now.when._36_4_ = local_218._36_4_;
    local_158.now.when.tm_gmtoff = local_218.tm_gmtoff;
    local_158.now.when.tm_mon = local_218.tm_mon;
    local_158.now.when.tm_year = local_218.tm_year;
    local_158.now.when.tm_wday = local_218.tm_wday;
    local_158.now.when.tm_yday = local_218.tm_yday;
    local_158.now.when.tm_sec = local_218.tm_sec;
    local_158.now.when.tm_min = local_218.tm_min;
    local_158.now.when.tm_hour = local_218.tm_hour;
    local_158.now.when.tm_mday = local_218.tm_mday;
    tVar4 = mktime((tm *)&local_158);
    local_158.now.when.tm_zone = local_1a8.tm_zone;
    local_158.now.when.tm_isdst = local_1a8.tm_isdst;
    local_158.now.when._36_4_ = local_1a8._36_4_;
    local_158.now.when.tm_gmtoff = local_1a8.tm_gmtoff;
    local_158.now.when.tm_mon = local_1a8.tm_mon;
    local_158.now.when.tm_year = local_1a8.tm_year;
    local_158.now.when.tm_wday = local_1a8.tm_wday;
    local_158.now.when.tm_yday = local_1a8.tm_yday;
    local_158.now.when.tm_sec = local_1a8.tm_sec;
    local_158.now.when.tm_min = local_1a8.tm_min;
    local_158.now.when.tm_hour = local_1a8.tm_hour;
    local_158.now.when.tm_mday = local_1a8.tm_mday;
    tVar5 = mktime((tm *)&local_158);
    if (tVar5 < tVar4) {
      local_218.tm_zone = local_1a8.tm_zone;
      local_218.tm_sec = local_1a8.tm_sec;
      local_218.tm_min = local_1a8.tm_min;
      local_218.tm_hour = local_1a8.tm_hour;
      local_218.tm_mday = local_1a8.tm_mday;
      local_218.tm_mon = local_1a8.tm_mon;
      local_218.tm_year = local_1a8.tm_year;
      local_218.tm_wday = local_1a8.tm_wday;
      local_218.tm_yday = local_1a8.tm_yday;
      local_218.tm_isdst = local_1a8.tm_isdst;
      local_218._36_4_ = local_1a8._36_4_;
      local_218.tm_gmtoff = local_1a8.tm_gmtoff;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"every 3 hours until tomorrow:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_168.range = &local_a8;
  local_168.step.value = 3.0;
  local_218.tm_zone = local_a8.begin_.when.tm_zone;
  local_218.tm_isdst = local_a8.begin_.when.tm_isdst;
  local_218._36_4_ = local_a8.begin_.when._36_4_;
  local_218.tm_gmtoff = local_a8.begin_.when.tm_gmtoff;
  local_218.tm_mon = local_a8.begin_.when.tm_mon;
  local_218.tm_year = local_a8.begin_.when.tm_year;
  local_218.tm_wday = local_a8.begin_.when.tm_wday;
  local_218.tm_yday = local_a8.begin_.when.tm_yday;
  local_218.tm_sec = local_a8.begin_.when.tm_sec;
  local_218.tm_min = local_a8.begin_.when.tm_min;
  local_218.tm_hour = local_a8.begin_.when.tm_hour;
  local_218.tm_mday = local_a8.begin_.when.tm_mday;
  tVar4 = mktime(&local_218);
  local_218.tm_zone = local_a8.end_.when.tm_zone;
  local_218.tm_isdst = local_a8.end_.when.tm_isdst;
  local_218._36_4_ = local_a8.end_.when._36_4_;
  local_218.tm_gmtoff = local_a8.end_.when.tm_gmtoff;
  local_218.tm_mon = local_a8.end_.when.tm_mon;
  local_218.tm_year = local_a8.end_.when.tm_year;
  local_218.tm_wday = local_a8.end_.when.tm_wday;
  local_218.tm_yday = local_a8.end_.when.tm_yday;
  local_218.tm_sec = local_a8.end_.when.tm_sec;
  local_218.tm_min = local_a8.end_.when.tm_min;
  local_218.tm_hour = local_a8.end_.when.tm_hour;
  local_218.tm_mday = local_a8.end_.when.tm_mday;
  tVar5 = mktime(&local_218);
  ppVar3 = local_168.range;
  if (tVar5 < tVar4) {
    local_158.now.when.tm_zone = ((local_168.range)->begin_).when.tm_zone;
    local_158.now.when.tm_sec = ((local_168.range)->begin_).when.tm_sec;
    local_158.now.when.tm_min = ((local_168.range)->begin_).when.tm_min;
    local_158.now.when.tm_hour = ((local_168.range)->begin_).when.tm_hour;
    local_158.now.when.tm_mday = ((local_168.range)->begin_).when.tm_mday;
    local_158.now.when.tm_mon = ((local_168.range)->begin_).when.tm_mon;
    local_158.now.when.tm_year = ((local_168.range)->begin_).when.tm_year;
    local_158.now.when.tm_wday = ((local_168.range)->begin_).when.tm_wday;
    local_158.now.when.tm_yday = ((local_168.range)->begin_).when.tm_yday;
    local_158.now.when.tm_isdst = ((local_168.range)->begin_).when.tm_isdst;
    local_158.now.when._36_4_ = *(undefined4 *)&((local_168.range)->begin_).when.field_0x24;
    local_158.now.when.tm_gmtoff = ((local_168.range)->begin_).when.tm_gmtoff;
    tVar4 = mktime((tm *)&local_158);
    local_268._0_8_ = tVar4 + -1;
    localtime_r((time_t *)&local_268,(tm *)&local_158);
    local_218.tm_zone = (ppVar3->end_).when.tm_zone;
    local_218.tm_sec = (ppVar3->end_).when.tm_sec;
    local_218.tm_min = (ppVar3->end_).when.tm_min;
    local_218.tm_hour = (ppVar3->end_).when.tm_hour;
    local_218.tm_mday = (ppVar3->end_).when.tm_mday;
    local_218.tm_mon = (ppVar3->end_).when.tm_mon;
    local_218.tm_year = (ppVar3->end_).when.tm_year;
    local_218.tm_wday = (ppVar3->end_).when.tm_wday;
    local_218.tm_yday = (ppVar3->end_).when.tm_yday;
    local_218.tm_isdst = (ppVar3->end_).when.tm_isdst;
    local_218._36_4_ = *(undefined4 *)&(ppVar3->end_).when.field_0x24;
    local_218.tm_gmtoff = (ppVar3->end_).when.tm_gmtoff;
    local_1b0 = (ppVar3->end_).when.tm_zone;
    local_1e0._0_4_ = (ppVar3->end_).when.tm_sec;
    local_1e0._4_4_ = (ppVar3->end_).when.tm_min;
    uStack_1d8._0_4_ = (ppVar3->end_).when.tm_hour;
    uStack_1d8._4_4_ = (ppVar3->end_).when.tm_mday;
    local_1d0._0_4_ = (ppVar3->end_).when.tm_mon;
    local_1d0._4_4_ = (ppVar3->end_).when.tm_year;
    uStack_1c8._0_4_ = (ppVar3->end_).when.tm_wday;
    uStack_1c8._4_4_ = (ppVar3->end_).when.tm_yday;
    local_1c0 = *(undefined8 *)&(ppVar3->end_).when.tm_isdst;
    lStack_1b8 = (ppVar3->end_).when.tm_gmtoff;
  }
  else {
    local_158.now.when.tm_zone = ((local_168.range)->end_).when.tm_zone;
    local_158.now.when.tm_sec = ((local_168.range)->end_).when.tm_sec;
    local_158.now.when.tm_min = ((local_168.range)->end_).when.tm_min;
    local_158.now.when.tm_hour = ((local_168.range)->end_).when.tm_hour;
    local_158.now.when.tm_mday = ((local_168.range)->end_).when.tm_mday;
    local_158.now.when.tm_mon = ((local_168.range)->end_).when.tm_mon;
    local_158.now.when.tm_year = ((local_168.range)->end_).when.tm_year;
    local_158.now.when.tm_wday = ((local_168.range)->end_).when.tm_wday;
    local_158.now.when.tm_yday = ((local_168.range)->end_).when.tm_yday;
    local_158.now.when.tm_isdst = ((local_168.range)->end_).when.tm_isdst;
    local_158.now.when._36_4_ = *(undefined4 *)&((local_168.range)->end_).when.field_0x24;
    local_158.now.when.tm_gmtoff = ((local_168.range)->end_).when.tm_gmtoff;
    tVar4 = mktime((tm *)&local_158);
    local_268._0_8_ = tVar4 + 1;
    localtime_r((time_t *)&local_268,(tm *)&local_158);
    local_218.tm_zone = (ppVar3->begin_).when.tm_zone;
    local_218.tm_sec = (ppVar3->begin_).when.tm_sec;
    local_218.tm_min = (ppVar3->begin_).when.tm_min;
    local_218.tm_hour = (ppVar3->begin_).when.tm_hour;
    local_218.tm_mday = (ppVar3->begin_).when.tm_mday;
    local_218.tm_mon = (ppVar3->begin_).when.tm_mon;
    local_218.tm_year = (ppVar3->begin_).when.tm_year;
    local_218.tm_wday = (ppVar3->begin_).when.tm_wday;
    local_218.tm_yday = (ppVar3->begin_).when.tm_yday;
    local_218.tm_isdst = (ppVar3->begin_).when.tm_isdst;
    local_218._36_4_ = *(undefined4 *)&(ppVar3->begin_).when.field_0x24;
    local_218.tm_gmtoff = (ppVar3->begin_).when.tm_gmtoff;
    local_1b0 = (ppVar3->begin_).when.tm_zone;
    local_1e0._0_4_ = (ppVar3->begin_).when.tm_sec;
    local_1e0._4_4_ = (ppVar3->begin_).when.tm_min;
    uStack_1d8._0_4_ = (ppVar3->begin_).when.tm_hour;
    uStack_1d8._4_4_ = (ppVar3->begin_).when.tm_mday;
    local_1d0._0_4_ = (ppVar3->begin_).when.tm_mon;
    local_1d0._4_4_ = (ppVar3->begin_).when.tm_year;
    uStack_1c8._0_4_ = (ppVar3->begin_).when.tm_wday;
    uStack_1c8._4_4_ = (ppVar3->begin_).when.tm_yday;
    local_1c0 = *(undefined8 *)&(ppVar3->begin_).when.tm_isdst;
    lStack_1b8 = (ppVar3->begin_).when.tm_gmtoff;
  }
  local_170 = local_168.step.value;
  local_1a8._0_8_ = local_158.now.when._0_8_;
  local_1a8._8_8_ = local_158.now.when._8_8_;
  local_1a8._16_8_ = local_158.now.when._16_8_;
  local_1a8._24_8_ = local_158.now.when._24_8_;
  local_1a8._32_8_ = local_158.now.when._32_8_;
  local_1a8.tm_gmtoff = local_158.now.when.tm_gmtoff;
  local_1a8.tm_zone = local_158.now.when.tm_zone;
  asap::detail::accessor<3600UL>::end(&local_158,&local_168);
  local_268.tm_zone = local_158.now.when.tm_zone;
  local_268.tm_isdst = local_158.now.when.tm_isdst;
  local_268._36_4_ = local_158.now.when._36_4_;
  local_268.tm_gmtoff = local_158.now.when.tm_gmtoff;
  local_268.tm_mon = local_158.now.when.tm_mon;
  local_268.tm_year = local_158.now.when.tm_year;
  local_268.tm_wday = local_158.now.when.tm_wday;
  local_268.tm_yday = local_158.now.when.tm_yday;
  local_268.tm_sec = local_158.now.when.tm_sec;
  local_268.tm_min = local_158.now.when.tm_min;
  local_268.tm_hour = local_158.now.when.tm_hour;
  local_268.tm_mday = local_158.now.when.tm_mday;
  tVar4 = mktime((tm *)&local_268);
  local_268.tm_zone = local_218.tm_zone;
  local_268.tm_isdst = local_218.tm_isdst;
  local_268._36_4_ = local_218._36_4_;
  local_268.tm_gmtoff = local_218.tm_gmtoff;
  local_268.tm_mon = local_218.tm_mon;
  local_268.tm_year = local_218.tm_year;
  local_268.tm_wday = local_218.tm_wday;
  local_268.tm_yday = local_218.tm_yday;
  local_268.tm_sec = local_218.tm_sec;
  local_268.tm_min = local_218.tm_min;
  local_268.tm_hour = local_218.tm_hour;
  local_268.tm_mday = local_218.tm_mday;
  tVar5 = mktime((tm *)&local_268);
  if (tVar4 != tVar5) {
    do {
      local_268.tm_zone = local_218.tm_zone;
      local_268.tm_isdst = local_218.tm_isdst;
      local_268._36_4_ = local_218._36_4_;
      local_268.tm_gmtoff = local_218.tm_gmtoff;
      local_268.tm_mon = local_218.tm_mon;
      local_268.tm_year = local_218.tm_year;
      local_268.tm_wday = local_218.tm_wday;
      local_268.tm_yday = local_218.tm_yday;
      local_268.tm_sec = local_218.tm_sec;
      local_268.tm_min = local_218.tm_min;
      local_268.tm_hour = local_218.tm_hour;
      local_268.tm_mday = local_218.tm_mday;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
      asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                       (datetime *)&local_268);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      dVar2 = local_170;
      local_218.tm_hour = local_218.tm_hour + (int)local_170;
      dVar1 = floor(local_170);
      dVar2 = (dVar2 - dVar1) * 60.0;
      local_218.tm_min = local_218.tm_min + (int)dVar2;
      dVar1 = floor(dVar2);
      local_218.tm_sec = local_218.tm_sec + (int)((dVar2 - dVar1) * 60.0);
      mktime(&local_218);
      local_268.tm_zone = local_218.tm_zone;
      local_268.tm_isdst = local_218.tm_isdst;
      local_268._36_4_ = local_218._36_4_;
      local_268.tm_gmtoff = local_218.tm_gmtoff;
      local_268.tm_mon = local_218.tm_mon;
      local_268.tm_year = local_218.tm_year;
      local_268.tm_wday = local_218.tm_wday;
      local_268.tm_yday = local_218.tm_yday;
      local_268.tm_sec = local_218.tm_sec;
      local_268.tm_min = local_218.tm_min;
      local_268.tm_hour = local_218.tm_hour;
      local_268.tm_mday = local_218.tm_mday;
      tVar4 = mktime((tm *)&local_268);
      local_268.tm_zone = local_1a8.tm_zone;
      local_268.tm_isdst = local_1a8.tm_isdst;
      local_268._36_4_ = local_1a8._36_4_;
      local_268.tm_gmtoff = local_1a8.tm_gmtoff;
      local_268.tm_mon = local_1a8.tm_mon;
      local_268.tm_year = local_1a8.tm_year;
      local_268.tm_wday = local_1a8.tm_wday;
      local_268.tm_yday = local_1a8.tm_yday;
      local_268.tm_sec = local_1a8.tm_sec;
      local_268.tm_min = local_1a8.tm_min;
      local_268.tm_hour = local_1a8.tm_hour;
      local_268.tm_mday = local_1a8.tm_mday;
      tVar5 = mktime((tm *)&local_268);
      if (tVar5 < tVar4) {
        local_218.tm_zone = local_1a8.tm_zone;
        local_218.tm_isdst = local_1a8.tm_isdst;
        local_218._36_4_ = local_1a8._36_4_;
        local_218.tm_gmtoff = local_1a8.tm_gmtoff;
        local_218.tm_mon = local_1a8.tm_mon;
        local_218.tm_year = local_1a8.tm_year;
        local_218.tm_wday = local_1a8.tm_wday;
        local_218.tm_yday = local_1a8.tm_yday;
        local_218.tm_sec = local_1a8.tm_sec;
        local_218.tm_min = local_1a8.tm_min;
        local_218.tm_hour = local_1a8.tm_hour;
        local_218.tm_mday = local_1a8.tm_mday;
      }
      local_268.tm_zone = local_158.now.when.tm_zone;
      local_268.tm_isdst = local_158.now.when.tm_isdst;
      local_268._36_4_ = local_158.now.when._36_4_;
      local_268.tm_gmtoff = local_158.now.when.tm_gmtoff;
      local_268.tm_mon = local_158.now.when.tm_mon;
      local_268.tm_year = local_158.now.when.tm_year;
      local_268.tm_wday = local_158.now.when.tm_wday;
      local_268.tm_yday = local_158.now.when.tm_yday;
      local_268.tm_sec = local_158.now.when.tm_sec;
      local_268.tm_min = local_158.now.when.tm_min;
      local_268.tm_hour = local_158.now.when.tm_hour;
      local_268.tm_mday = local_158.now.when.tm_mday;
      tVar4 = mktime((tm *)&local_268);
      local_268.tm_zone = local_218.tm_zone;
      local_268.tm_isdst = local_218.tm_isdst;
      local_268._36_4_ = local_218._36_4_;
      local_268.tm_gmtoff = local_218.tm_gmtoff;
      local_268.tm_mon = local_218.tm_mon;
      local_268.tm_year = local_218.tm_year;
      local_268.tm_wday = local_218.tm_wday;
      local_268.tm_yday = local_218.tm_yday;
      local_268.tm_sec = local_218.tm_sec;
      local_268.tm_min = local_218.tm_min;
      local_268.tm_hour = local_218.tm_hour;
      local_268.tm_mday = local_218.tm_mday;
      tVar5 = mktime((tm *)&local_268);
    } while (tVar4 != tVar5);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* Creates a period, from now until tomorrow. */
  auto period = asap::now().until(asap::tomorrow());

  /* Iterates from now until tomorrow, by every hour, using oldschool iterators.
   * Be aware that tomorrow happens to be next day *exactly* at midnight, which means
   * unless asap::now() is exactly at 0 minutes and 0 seconds, the next day will
   * never be printed. */
  auto everyhour = period.every(asap::hours(1));
  std::cout << "every hour until tomorrow:" << std::endl;
  for (auto i = everyhour.begin(); i != everyhour.end(); i++) {
    std::cout << "* " << *i << std::endl;
  }
  std::cout << std::endl;

  /* you can also use the newschool for :) */
  std::cout << "every 3 hours until tomorrow:" << std::endl;
  for (auto d: period.every(asap::hour(3))) {
    std::cout << "* " << d << std::endl;
  }

  return 0;
}